

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_manipulation.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  ct_binary_expr<_36ba204c_> local_40;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Evaluate (1-x-y)xy at (1,2,5):");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<double>(-4.0);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Replace ( (1-x-y)xy, x) and evaluate at (1,2,5):")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
                       *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<double>(-60.0);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Differentiate (1-x-y)xy with respect to x and evaluate the result at (1,2,5):"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_constant<1L>_>,_viennamath::op_minus<double>,_viennamath::ct_constant<0L>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_constant<0L>_>_>
                       *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<double>(-6.0);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Evaluation test of super-complicated expression:")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<double>(-1.0);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Expanding (1-x)*(1-y)*(1-z):");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = viennamath::operator<<((ostream *)&std::cout,&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<double>(0.0);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<double>(0.0);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Extracting coefficients from (1-x)*(1-y)*(1-z):");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"x: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_constant<0L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_constant<0L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>_>_>_>
                              *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"y: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_constant<0L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_constant<0L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>_>_>_>
                              *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"z: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>_>_>_>
                              *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Dropping coefficients from (1-x)*(1-y)*(1-z):");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Drop x-terms: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>_>_>
                              *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Drop y-terms: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>_>_>
                              *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Drop z-terms: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>_>_>
                              *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Integrate x*y:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"with respect to x on [0,1]: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>
                              *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"with respect to y on [0,1]: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>
                              *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Integrate (1-x)*(1-y)*x*y: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"with respect to x on [0,1]: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>_>
                              *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"with respect to y on [0,1]: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>_>
                              *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Integration on unit triangle:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"1: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>
                              *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"x: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<6L>_>
                              *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"y: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<6L>_>
                              *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"1-x-y: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<6L>_>
                              *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"x^2: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<12L>_>
                              *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"y^2: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<12L>_>
                              *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"(1-x-y)^2: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<12L>_>
                              *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"x*y: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<24L>_>
                              *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"x*(1-x-y): ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<24L>_>
                              *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"y*(1-x-y): ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<24L>_>
                              *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"************************************************")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"*****     TEST COMPLETED SUCCESSFULLY!     *****")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"************************************************")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main()
{
  viennamath::ct_constant<0> c0;
  viennamath::ct_constant<1> c1;
  viennamath::ct_constant<2> c2;
  viennamath::ct_constant<5> c5;
  viennamath::ct_constant<7> c7;

  viennamath::ct_variable<0> x;
  viennamath::ct_variable<1> y;
  viennamath::ct_variable<2> z;

  std::cout << "Evaluate (1-x-y)xy at (1,2,5):" << std::endl;
  std::cout << viennamath::eval( (c1 - x - y) * x * y, viennamath::make_vector(c1, c2, c5) ) << std::endl;

  std::cout << "Replace ( (1-x-y)xy, x) and evaluate at (1,2,5):" << std::endl;
  std::cout << viennamath::substitute(x, z, (c1 - x - y) * x * y) << std::endl;
  std::cout << viennamath::eval(
                  viennamath::substitute(x, z, (c1 - x - y) * x * y),
                  viennamath::make_vector(c1, c2, c5)
               ) << std::endl;

  std::cout << "Differentiate (1-x-y)xy with respect to x and evaluate the result at (1,2,5):" << std::endl;
  std::cout << viennamath::diff((c1 - x - y) * x * y, x) << std::endl;
  /*std::cout << viennamath::ct_eval(
                  viennamath::diff((c1 - x - y) * x * y, x),
                  viennamath::make_vector(c1, c2, c5)
               ) << std::endl;*/
  std::cout << viennamath::eval(
                  viennamath::diff((c1 - x - y) * x * y, x),
                  viennamath::make_vector(c1, c2, c5)
               ) << std::endl;

  std::cout << "Evaluation test of super-complicated expression:" << std::endl;
  /*std::cout << viennamath::ct_eval(
                viennamath::diff((c1 - x - y/x) * x * y / (c2 - y / (x + y)) * (x + y) / (z+x), x) - c1 / (c2  + c2),
                viennamath::make_vector(c1, c2, c5)
              ) << std::endl;*/
  std::cout << viennamath::eval(
                viennamath::diff((c1 - x - y/x) * x * y / (c2 - y / (x + y)) * (x + y) / (z+x), x) - c1 / (c2  + c2),
                viennamath::make_vector(c1, c2, c5)
              ) << std::endl;


  std::cout << "Expanding (1-x)*(1-y)*(1-z):" << std::endl;
  std::cout << viennamath::expand( (c1 - x) * (c1 - y) * (c1 - z) ) << std::endl;
  std::cout << viennamath::eval(
                (c1 - x) * (c1 - y) * (c1 - z),
                viennamath::make_vector(c1, c2, c5)
              ) << std::endl;
  std::cout << viennamath::eval(
                viennamath::expand( (c1 - x) * (c1 - y) * (c1 - z) ),
                viennamath::make_vector(c1, c2, c5)
              ) << std::endl;


  std::cout << "Extracting coefficients from (1-x)*(1-y)*(1-z):" << std::endl;
  std::cout << "x: " << viennamath::coefficient(x, (c1 - x) * (c1 - y) * (c1 - z) ) << std::endl;
  std::cout << "y: " << viennamath::coefficient(y, (c1 - x) * (c1 - y) * (c1 - z) ) << std::endl;
  std::cout << "z: " << viennamath::coefficient(z, (c1 - x) * (c1 - y) * (c1 - z) ) << std::endl;

  std::cout << "Dropping coefficients from (1-x)*(1-y)*(1-z):" << std::endl;
  std::cout << "Drop x-terms: " << viennamath::drop_dependent_terms(x, (c1 - x) * (c1 - y) * (c1 - z) ) << std::endl;
  std::cout << "Drop y-terms: " << viennamath::drop_dependent_terms(y, (c1 - x) * (c1 - y) * (c1 - z) ) << std::endl;
  std::cout << "Drop z-terms: " << viennamath::drop_dependent_terms(z, (c1 - x) * (c1 - y) * (c1 - z) ) << std::endl;


  std::cout << "Integrate x*y:" << std::endl;
  std::cout << "with respect to x on [0,1]: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                                        x*y,
                                                                        x) << std::endl;
  std::cout << "with respect to y on [0,1]: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                                        x*y,
                                                                        y) << std::endl;

  std::cout << "Integrate (1-x)*(1-y)*x*y: " << std::endl;

  std::cout << "with respect to x on [0,1]: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                                         (c1-x)*(c1-y)*x*y,
                                                                         x) << std::endl;
  std::cout << "with respect to y on [0,1]: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                                         (c1-x)*(c1-y)*x*y,
                                                                         y) << std::endl;


  std::cout << "Integration on unit triangle:" << std::endl;
  std::cout << "1: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                               viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                      c1,
                                                                      y),
                                               x) << std::endl;
  //linear
  std::cout << "x: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                               viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                      x,
                                                                      y),
                                               x) << std::endl;
  std::cout << "y: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                               viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                      y,
                                                                      y),
                                               x) << std::endl;
  std::cout << "1-x-y: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                   viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                          c1 - x - y,
                                                                          y),
                                                    x) << std::endl;

  //quadratic:
  std::cout << "x^2: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                 viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                        x*x,
                                                                        y),
                                                 x) << std::endl;
  std::cout << "y^2: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                 viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                        y*y,
                                                                        y),
                                                 x) << std::endl;

  std::cout << "(1-x-y)^2: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                       viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                              (c1 - x - y) * (c1 - x - y),
                                                                              y),
                                                       x) << std::endl;
  std::cout << "x*y: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                 viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                        x*y,
                                                                        y),
                                                 x) << std::endl;
  std::cout << "x*(1-x-y): " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                       viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                              x*(c1 - x - y),
                                                                              y),
                                                       x) << std::endl;
  std::cout << "y*(1-x-y): " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                       viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                              y*(c1 - x - y),
                                                                              y),
                                                       x) << std::endl;

  std::cout << "************************************************" << std::endl;
  std::cout << "*****     TEST COMPLETED SUCCESSFULLY!     *****" << std::endl;
  std::cout << "************************************************" << std::endl;

  return EXIT_SUCCESS;
}